

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

int NULLC::IsCoroutineReset(NULLCRef f)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  char *error;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if (pEVar1->subCat == CAT_FUNCTION) {
    pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                        *(uint *)((undefined8 *)CONCAT44(f.typeID,in_stack_0000000c) + 1));
    if (pEVar2->funcCat == '\x03') {
      return (uint)(**(int **)CONCAT44(f.typeID,in_stack_0000000c) == 0);
    }
    error = "Function is not a coroutine";
  }
  else {
    error = "Argument is not a function";
  }
  nullcThrowError(error);
  return 0;
}

Assistant:

int NULLC::IsCoroutineReset(NULLCRef f)
{
	if(linker->exTypes[f.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
	{
		nullcThrowError("Argument is not a function");
		return 0;
	}
	NULLCFuncPtr *fPtr = (NULLCFuncPtr*)f.ptr;
	if(linker->exFunctions[fPtr->id].funcCat != ExternFuncInfo::COROUTINE)
	{
		nullcThrowError("Function is not a coroutine");
		return 0;
	}

	unsigned jmpOffset = *(unsigned*)fPtr->context;
	return jmpOffset == 0;
}